

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void rowSetTreeToList(RowSetEntry *pIn,RowSetEntry **ppFirst,RowSetEntry **ppLast)

{
  RowSetEntry *pRVar1;
  RowSetEntry *p;
  RowSetEntry *local_20;
  
  do {
    pRVar1 = pIn;
    if (pRVar1->pLeft == (RowSetEntry *)0x0) {
      *ppFirst = pRVar1;
    }
    else {
      rowSetTreeToList(pRVar1->pLeft,ppFirst,&local_20);
      local_20->pRight = pRVar1;
    }
    ppFirst = &pRVar1->pRight;
    pIn = pRVar1->pRight;
  } while (pRVar1->pRight != (RowSetEntry *)0x0);
  *ppLast = pRVar1;
  return;
}

Assistant:

static void rowSetTreeToList(
  struct RowSetEntry *pIn,         /* Root of the input tree */
  struct RowSetEntry **ppFirst,    /* Write head of the output list here */
  struct RowSetEntry **ppLast      /* Write tail of the output list here */
){
  assert( pIn!=0 );
  if( pIn->pLeft ){
    struct RowSetEntry *p;
    rowSetTreeToList(pIn->pLeft, ppFirst, &p);
    p->pRight = pIn;
  }else{
    *ppFirst = pIn;
  }
  if( pIn->pRight ){
    rowSetTreeToList(pIn->pRight, &pIn->pRight, ppLast);
  }else{
    *ppLast = pIn;
  }
  assert( (*ppLast)->pRight==0 );
}